

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProxyLogger.cpp
# Opt level: O1

void __thiscall liblogger::ProxyLogger::LogError(ProxyLogger *this,char *fmt,...)

{
  char in_AL;
  int iVar1;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  char *tmp;
  string str;
  va_list ap;
  allocator<char> local_111;
  char *local_110;
  long *local_108 [2];
  long local_f8 [2];
  undefined8 local_e8;
  char **local_e0;
  undefined1 *local_d8;
  undefined1 local_c8 [16];
  undefined8 local_b8;
  undefined8 local_b0;
  undefined8 local_a8;
  undefined8 local_a0;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  undefined8 local_38;
  undefined8 local_28;
  
  local_d8 = local_c8;
  if (in_AL != '\0') {
    local_98 = in_XMM0_Qa;
    local_88 = in_XMM1_Qa;
    local_78 = in_XMM2_Qa;
    local_68 = in_XMM3_Qa;
    local_58 = in_XMM4_Qa;
    local_48 = in_XMM5_Qa;
    local_38 = in_XMM6_Qa;
    local_28 = in_XMM7_Qa;
  }
  local_110 = (char *)0x0;
  local_e0 = &tmp;
  local_e8 = 0x3000000010;
  local_b8 = in_RDX;
  local_b0 = in_RCX;
  local_a8 = in_R8;
  local_a0 = in_R9;
  iVar1 = vasprintf(&local_110,fmt,&local_e8);
  if (-1 < iVar1) {
    std::__cxx11::string::string<std::allocator<char>>((string *)local_108,local_110,&local_111);
    liblogger::Logger(LOGGER_ERR,"%s %s ",(this->m_prefix)._M_dataplus._M_p,local_108[0]);
    free(local_110);
    if (local_108[0] != local_f8) {
      operator_delete(local_108[0],local_f8[0] + 1);
    }
    return;
  }
  abort();
}

Assistant:

void ProxyLogger::LogError(const char *fmt, ...) {
	char *tmp = 0;

	va_list ap;
	va_start(ap, fmt);
	int res = vasprintf(&tmp, fmt, ap);
	if (res < 0)
		abort();
	std::string str = tmp;
	liblogger::Logger(LOGGER_ERR, "%s %s ", m_prefix.c_str(), str.c_str());
	free(tmp);
	va_end(ap);
}